

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

void singlesocket(Curl_multi *multi,SessionHandle *data)

{
  curl_socket_t *__dest;
  int *piVar1;
  curl_hash *h;
  connectdata *pcVar2;
  curl_llist *pcVar3;
  uint uVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  undefined8 *p;
  void *pvVar9;
  long *plVar10;
  ulong uVar11;
  int in_EDX;
  SessionHandle *pSVar12;
  uint uVar13;
  SessionHandle *pSVar14;
  ulong uVar15;
  curl_socket_t s;
  curl_socket_t local_5c;
  SessionHandle *local_58;
  uint local_4c;
  curl_socket_t socks [5];
  
  for (lVar8 = 0; lVar8 != 5; lVar8 = lVar8 + 1) {
    socks[lVar8] = -1;
  }
  local_58 = data;
  uVar6 = multi_getsock(data,socks,in_EDX);
  lVar8 = 0;
  do {
    if (lVar8 == 5) {
      local_4c = 5;
LAB_0045ecda:
      __dest = local_58->sockets;
      uVar15 = (ulong)local_4c;
      lVar8 = 0;
      pSVar14 = local_58;
      do {
        if (pSVar14->numsocks <= lVar8) {
          memcpy(__dest,socks,uVar15 << 2);
          pSVar14->numsocks = local_4c;
          return;
        }
        s = __dest[lVar8];
        uVar11 = 0;
        do {
          if (uVar15 == uVar11) {
            if ((s == -1) ||
               (plVar10 = (long *)Curl_hash_pick(multi->sockhash,&s,4), pSVar14 = local_58,
               plVar10 == (long *)0x0)) goto LAB_0045ede5;
            pcVar2 = local_58->easy_conn;
            if (pcVar2 != (connectdata *)0x0) {
              pcVar3 = pcVar2->recv_pipe;
              bVar5 = true;
              if ((pcVar3 != (curl_llist *)0x0) && (1 < pcVar3->size)) {
                if ((SessionHandle *)*plVar10 == local_58) {
                  pSVar12 = (SessionHandle *)pcVar3->head->ptr;
                  if (pSVar12 == local_58) {
                    pSVar12 = (SessionHandle *)pcVar3->head->next->ptr;
                  }
                  *plVar10 = (long)pSVar12;
                }
                bVar5 = false;
              }
              pcVar3 = pcVar2->send_pipe;
              if ((pcVar3 != (curl_llist *)0x0) && (1 < pcVar3->size)) {
                if ((SessionHandle *)*plVar10 == local_58) {
                  pSVar12 = (SessionHandle *)pcVar3->head->ptr;
                  if (pSVar12 == local_58) {
                    *plVar10 = (long)pcVar3->head->next->ptr;
                  }
                  else {
                    *plVar10 = (long)pSVar12;
                  }
                }
                goto LAB_0045ede5;
              }
              if (!bVar5) goto LAB_0045ede5;
            }
            if (multi->socket_cb != (curl_socket_callback)0x0) {
              (*multi->socket_cb)(local_58,s,4,multi->socket_userp,(void *)plVar10[3]);
            }
            sh_delentry(multi->sockhash,s);
            pSVar14 = local_58;
            goto LAB_0045ede5;
          }
          piVar1 = socks + uVar11;
          uVar11 = uVar11 + 1;
        } while (s != *piVar1);
        s = -1;
LAB_0045ede5:
        lVar8 = lVar8 + 1;
      } while( true );
    }
    if ((uVar6 >> ((byte)lVar8 & 0x1f) & 0x10001) == 0) {
      local_4c = (uint)lVar8;
      goto LAB_0045ecda;
    }
    s = socks[lVar8];
    p = (undefined8 *)Curl_hash_pick(multi->sockhash,&s,4);
    uVar13 = uVar6 >> ((byte)lVar8 & 0x1f);
    uVar7 = uVar13 & 1;
    uVar4 = uVar7 + 2;
    if ((uVar13 >> 0x10 & 1) == 0) {
      uVar4 = uVar7;
    }
    if (p == (undefined8 *)0x0) {
      h = multi->sockhash;
      local_5c = s;
      p = (undefined8 *)Curl_hash_pick(h,&local_5c,4);
      if (p == (undefined8 *)0x0) {
        p = (undefined8 *)(*Curl_ccalloc)(1,0x20);
        if (p == (undefined8 *)0x0) {
          return;
        }
        *p = local_58;
        *(curl_socket_t *)((long)p + 0x14) = local_5c;
        pvVar9 = Curl_hash_add(h,&local_5c,4,p);
        if (pvVar9 == (void *)0x0) {
          (*Curl_cfree)(p);
          return;
        }
      }
LAB_0045eca7:
      if (multi->socket_cb != (curl_socket_callback)0x0) {
        (*multi->socket_cb)(local_58,s,uVar4,multi->socket_userp,(void *)p[3]);
      }
      *(uint *)(p + 2) = uVar4;
    }
    else if (*(uint *)(p + 2) != uVar4) goto LAB_0045eca7;
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

static void singlesocket(struct Curl_multi *multi,
                         struct SessionHandle *data)
{
  curl_socket_t socks[MAX_SOCKSPEREASYHANDLE];
  int i;
  struct Curl_sh_entry *entry;
  curl_socket_t s;
  int num;
  unsigned int curraction;
  bool remove_sock_from_hash;

  for(i=0; i< MAX_SOCKSPEREASYHANDLE; i++)
    socks[i] = CURL_SOCKET_BAD;

  /* Fill in the 'current' struct with the state as it is now: what sockets to
     supervise and for what actions */
  curraction = multi_getsock(data, socks, MAX_SOCKSPEREASYHANDLE);

  /* We have 0 .. N sockets already and we get to know about the 0 .. M
     sockets we should have from now on. Detect the differences, remove no
     longer supervised ones and add new ones */

  /* walk over the sockets we got right now */
  for(i=0; (i< MAX_SOCKSPEREASYHANDLE) &&
        (curraction & (GETSOCK_READSOCK(i) | GETSOCK_WRITESOCK(i)));
      i++) {
    int action = CURL_POLL_NONE;

    s = socks[i];

    /* get it from the hash */
    entry = Curl_hash_pick(multi->sockhash, (char *)&s, sizeof(s));

    if(curraction & GETSOCK_READSOCK(i))
      action |= CURL_POLL_IN;
    if(curraction & GETSOCK_WRITESOCK(i))
      action |= CURL_POLL_OUT;

    if(entry) {
      /* yeps, already present so check if it has the same action set */
      if(entry->action == action)
        /* same, continue */
        continue;
    }
    else {
      /* this is a socket we didn't have before, add it! */
      entry = sh_addentry(multi->sockhash, s, data);
      if(!entry)
        /* fatal */
        return;
    }

    /* we know (entry != NULL) at this point, see the logic above */
    if(multi->socket_cb)
      multi->socket_cb(data,
                       s,
                       action,
                       multi->socket_userp,
                       entry->socketp);

    entry->action = action; /* store the current action state */
  }

  num = i; /* number of sockets */

  /* when we've walked over all the sockets we should have right now, we must
     make sure to detect sockets that are removed */
  for(i=0; i< data->numsocks; i++) {
    int j;
    s = data->sockets[i];
    for(j=0; j<num; j++) {
      if(s == socks[j]) {
        /* this is still supervised */
        s = CURL_SOCKET_BAD;
        break;
      }
    }
    if(s != CURL_SOCKET_BAD) {

      /* this socket has been removed. Tell the app to remove it */
      remove_sock_from_hash = TRUE;

      entry = Curl_hash_pick(multi->sockhash, (char *)&s, sizeof(s));
      if(entry) {
        /* check if the socket to be removed serves a connection which has
           other easy-s in a pipeline. In this case the socket should not be
           removed. */
        struct connectdata *easy_conn = data->easy_conn;
        if(easy_conn) {
          if(easy_conn->recv_pipe && easy_conn->recv_pipe->size > 1) {
            /* the handle should not be removed from the pipe yet */
            remove_sock_from_hash = FALSE;

            /* Update the sockhash entry to instead point to the next in line
               for the recv_pipe, or the first (in case this particular easy
               isn't already) */
            if(entry->easy == data) {
              if(isHandleAtHead(data, easy_conn->recv_pipe))
                entry->easy = easy_conn->recv_pipe->head->next->ptr;
              else
                entry->easy = easy_conn->recv_pipe->head->ptr;
            }
          }
          if(easy_conn->send_pipe  && easy_conn->send_pipe->size > 1) {
            /* the handle should not be removed from the pipe yet */
            remove_sock_from_hash = FALSE;

            /* Update the sockhash entry to instead point to the next in line
               for the send_pipe, or the first (in case this particular easy
               isn't already) */
            if(entry->easy == data) {
              if(isHandleAtHead(data, easy_conn->send_pipe))
                entry->easy = easy_conn->send_pipe->head->next->ptr;
              else
                entry->easy = easy_conn->send_pipe->head->ptr;
            }
          }
          /* Don't worry about overwriting recv_pipe head with send_pipe_head,
             when action will be asked on the socket (see multi_socket()), the
             head of the correct pipe will be taken according to the
             action. */
        }
      }
      else
        /* just a precaution, this socket really SHOULD be in the hash already
           but in case it isn't, we don't have to tell the app to remove it
           either since it never got to know about it */
        remove_sock_from_hash = FALSE;

      if(remove_sock_from_hash) {
        /* in this case 'entry' is always non-NULL */
        if(multi->socket_cb)
          multi->socket_cb(data,
                           s,
                           CURL_POLL_REMOVE,
                           multi->socket_userp,
                           entry->socketp);
        sh_delentry(multi->sockhash, s);
      }

    }
  }

  memcpy(data->sockets, socks, num*sizeof(curl_socket_t));
  data->numsocks = num;
}